

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gens_opn2.cpp
# Opt level: O1

void __thiscall GensOPN2::nativeGenerateN(GensOPN2 *this,int16_t *output,size_t frames)

{
  int iVar1;
  Ym2612 *this_00;
  ulong uVar2;
  int iVar3;
  int32_t *piVar4;
  int32_t bufLR [512];
  int32_t local_828 [256];
  int32_t local_428 [256];
  
  if (frames < 0x101) {
    this_00 = this->chip;
    memset(local_828,0,0x800);
    LibGens::Ym2612::resetBufferPtrs(this_00,local_828,local_428);
    this_00->m_writeLen = this_00->m_writeLen + (int)frames;
    LibGens::Ym2612::specialUpdate(this_00);
    if (frames != 0) {
      uVar2 = 0;
      do {
        piVar4 = local_428;
        if ((uVar2 & 1) == 0) {
          piVar4 = local_828;
        }
        iVar1 = *(int *)((long)piVar4 + (uVar2 & 0xfffffffffffffffe) * 2);
        iVar3 = iVar1 + 3;
        if (-1 < iVar1) {
          iVar3 = iVar1;
        }
        iVar3 = iVar3 >> 2;
        if (iVar3 < -0x7fff) {
          iVar3 = -0x8000;
        }
        if (0x7ffe < iVar3) {
          iVar3 = 0x7fff;
        }
        output[uVar2] = (int16_t)iVar3;
        uVar2 = uVar2 + 1;
      } while (frames * 2 != uVar2);
    }
    return;
  }
  __assert_fail("frames <= maxFrames",
                "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/chips/gens_opn2.cpp"
                ,0x54,"virtual void GensOPN2::nativeGenerateN(int16_t *, size_t)");
}

Assistant:

void GensOPN2::nativeGenerateN(int16_t *output, size_t frames)
{
    enum { maxFrames = 256 };
    assert(frames <= maxFrames);

    LibGens::Ym2612 *chip = this->chip;
    int32_t bufLR[2 * maxFrames] = {};
    int32_t *bufL = &bufLR[0];
    int32_t *bufR = &bufLR[maxFrames];

    chip->resetBufferPtrs(bufL, bufR);
    chip->addWriteLen((int)frames);
    chip->specialUpdate();

    //TODO
    // chip->updateDacAndTimers(bufL, bufR, frames);

    for (size_t i = 0; i < 2 * frames; ++i)
    {
        int32_t sample = ((i & 1) ? bufR : bufL)[i / 2];
        sample /= 4; // has too high volume, attenuation needed
        sample = (sample < INT16_MIN) ? INT16_MIN : sample;
        sample = (sample > INT16_MAX) ? INT16_MAX : sample;
        output[i] = (int16_t)sample;
    }
}